

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

void __thiscall ON_wString::UrlEncode(ON_wString *this)

{
  uint uVar1;
  uint uVar2;
  ON_Internal_Empty_wString *pOVar3;
  wchar_t *s;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  wchar_t *__src;
  size_t __n;
  wchar_t *pwVar8;
  
  CopyArray(this);
  pwVar8 = this->m_s;
  pOVar3 = (ON_Internal_Empty_wString *)(pwVar8 + -3);
  if (pwVar8 == (wchar_t *)0x0) {
    pOVar3 = &empty_wstring;
  }
  uVar1 = (pOVar3->header).string_length;
  if ((int)uVar1 < 1) {
    s = (wchar_t *)0x0;
    puVar4 = (uint *)0x0;
  }
  else {
    if ((pOVar3->header).string_capacity < 1) {
      pwVar8 = (wchar_t *)0x0;
    }
    __n = 0;
    puVar4 = (uint *)0x0;
    s = (wchar_t *)0x0;
    do {
      uVar2 = *(uint *)((long)pwVar8 + __n);
      if (uVar2 == 0) break;
      if ((((uVar2 - 0x30 < 10) || (uVar2 - 0x61 < 0x1a)) || (uVar2 - 0x41 < 0x1a)) ||
         (0xff < (int)uVar2)) {
        if (puVar4 == (uint *)0x0) {
          puVar4 = (uint *)0x0;
        }
        else {
          *puVar4 = uVar2;
          puVar4 = puVar4 + 1;
        }
      }
      else {
        if (puVar4 == (uint *)0x0) {
          s = (wchar_t *)onmalloc((ulong)uVar1 * 0xc + 4);
          if (__n != 0) {
            CopyArray(this);
            __src = this->m_s;
            pOVar3 = (ON_Internal_Empty_wString *)(__src + -3);
            if (__src == (wchar_t *)0x0) {
              pOVar3 = &empty_wstring;
            }
            if ((pOVar3->header).string_capacity < 1) {
              __src = (wchar_t *)0x0;
            }
            memcpy(s,__src,__n);
          }
          puVar4 = (uint *)((long)s + __n);
        }
        uVar5 = uVar2 + 0xf;
        if (-1 < (int)uVar2) {
          uVar5 = uVar2;
        }
        uVar6 = (int)uVar5 >> 4;
        uVar7 = uVar6 + 0xf;
        if (-1 < (int)uVar6) {
          uVar7 = uVar6;
        }
        uVar7 = (uVar6 + 0x30) - (uVar7 & 0xfffffff0);
        if (9 < (int)uVar6 % 0x10) {
          uVar7 = (int)uVar6 % 0x10 + 0x37;
        }
        uVar5 = (uVar2 + 0x30) - (uVar5 & 0xfffffff0);
        if (9 < (int)uVar2 % 0x10) {
          uVar5 = (int)uVar2 % 0x10 + 0x37;
        }
        *puVar4 = 0x25;
        puVar4[1] = uVar7;
        puVar4[2] = uVar5;
        puVar4 = puVar4 + 3;
      }
      __n = __n + 4;
    } while ((ulong)uVar1 << 2 != __n);
  }
  if (puVar4 == (uint *)0x0) {
    return;
  }
  *puVar4 = 0;
  operator=(this,s);
  onfree(s);
  return;
}

Assistant:

void ON_wString::UrlEncode()
{
  wchar_t c, c0, c1;
  wchar_t* buffer = 0;
  wchar_t* s1 = 0;
  const wchar_t* s = Array();
  const int count = Length();
  int i;

  for ( i = 0; i < count; i++ )
  {
    c = *s++;
    if ( 0 == c )
      break;
    if ('0' <= c && c <= '9')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('a' <= c && c <= 'z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if ('A' <= c && c <= 'Z')
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }
    if (c >= 256)
    {
      if ( s1 )
        *s1++ = c;
      continue;
    }

    // convert this character to %xx
    if ( !s1 )
    {
      buffer = (wchar_t*)onmalloc((count*3 + 1)*sizeof(buffer[0]));
      if ( i > 0 )
        memcpy(buffer,Array(),i*sizeof(buffer[0]));
      s1 = buffer+i;
    }
    c0 = ((c/16)%16) + '0';
    if ( c0 > '9' )
      c0 += ('A'-'9'-1);
    c1 = (c%16) + '0';
    if ( c1 > '9' )
      c1 += ('A'-'9'-1);
    *s1++ = '%';
    *s1++ = c0;
    *s1++ = c1;
  }
  if ( s1 )
  {
    *s1 = 0;
    *this = buffer;
    onfree(buffer);
  }
}